

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QList<int>_>::moveAppend
          (QGenericArrayOps<QList<int>_> *this,QList<int> *b,QList<int> *e)

{
  QList<int> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QList<int> *in_RDI;
  QList<int> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QList<int>_>::begin((QArrayDataPointer<QList<int>_> *)0x82ff47);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QList<int>::QList(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      (in_RDI->d).size = (in_RDI->d).size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }